

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_4x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  ulong *puVar1;
  undefined1 (*pauVar2) [16];
  int *piVar3;
  undefined8 *puVar4;
  byte bVar5;
  code *pcVar6;
  undefined8 uVar7;
  int8_t *piVar8;
  uint uVar9;
  long lVar10;
  undefined7 in_register_00000009;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong *puVar15;
  undefined1 *puVar16;
  bool bVar17;
  __m128i round;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  int iStack_40;
  int iStack_3c;
  
  piVar8 = av1_fwd_txfm_shift_ls[5];
  puVar16 = local_b8;
  uVar13 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  bVar17 = 0xf < tx_type;
  uVar12 = 0xbeaf >> (tx_type & 0x1f);
  uVar9 = 0x7f1f >> (tx_type & 0x1f);
  iVar14 = (int)*av1_fwd_txfm_shift_ls[5];
  puVar1 = (ulong *)(input + stride * 4);
  lVar11 = (long)stride;
  if ((uVar12 & 1) != 0 || bVar17) {
    local_b8._0_8_ = *(undefined8 *)input;
    local_a8._0_8_ = *(undefined8 *)(input + lVar11);
    local_98._0_8_ = *(undefined8 *)(input + stride * 2);
    puVar15 = (ulong *)(input + stride * 3);
    input = (int16_t *)puVar1;
  }
  else {
    local_b8._0_8_ = *(ulong *)((long)puVar1 + (long)(stride * 3) * 2);
    local_a8._0_8_ = *(ulong *)((long)puVar1 + (long)(stride * 2) * 2);
    local_98._0_8_ = *(ulong *)((long)puVar1 + lVar11 * 2);
    puVar15 = puVar1;
  }
  local_98._8_8_ = 0;
  local_a8._8_8_ = 0;
  local_b8._8_8_ = 0;
  pcVar6 = *(code **)((long)row_highbd_txfm4x4_arr + uVar13);
  local_88._0_8_ = *puVar15;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_88._0_8_;
  if ((uVar9 & 1) == 0 && !bVar17) {
    auVar19 = pshuflw(auVar18,local_b8,0x1b);
    local_b8._0_8_ = auVar19._0_8_;
    auVar19 = pshuflw(auVar19,local_a8,0x1b);
    local_a8._0_8_ = auVar19._0_8_;
    auVar19 = pshuflw(auVar19,local_98,0x1b);
    local_98._0_8_ = auVar19._0_8_;
    auVar18 = pshuflw(auVar19,auVar18,0x1b);
    local_88._0_8_ = auVar18._0_8_;
  }
  auVar18 = pmovsxwd(in_XMM1,local_b8._0_8_);
  auVar19 = pmovsxwd(in_XMM2,local_a8._0_8_);
  auVar22 = pmovsxwd(in_XMM3,local_98._0_8_);
  auVar23 = pmovsxwd(in_XMM4,local_88._0_8_);
  local_b8._4_4_ = auVar18._4_4_;
  local_b8._0_4_ = auVar18._0_4_ << iVar14;
  local_b8._8_4_ = auVar18._8_4_;
  local_b8._12_4_ = auVar18._12_4_;
  local_a8._0_4_ = auVar19._0_4_ << iVar14;
  local_a8._4_4_ = auVar19._4_4_;
  local_a8._8_4_ = auVar19._8_4_;
  local_a8._12_4_ = auVar19._12_4_;
  local_98._0_4_ = auVar22._0_4_ << iVar14;
  local_98._4_4_ = auVar22._4_4_;
  local_98._8_4_ = auVar22._8_4_;
  local_98._12_4_ = auVar22._12_4_;
  local_88._0_4_ = auVar23._0_4_ << iVar14;
  local_88._4_4_ = auVar23._4_4_;
  local_88._8_4_ = auVar23._8_4_;
  local_88._12_4_ = auVar23._12_4_;
  if ((uVar12 & 1) == 0 && !bVar17) {
    local_78._0_8_ = *(ulong *)((long)input + (long)(stride * 3) * 2);
    local_68._0_8_ = *(ulong *)((long)input + (long)(stride * 2) * 2);
    local_58._0_8_ = *(ulong *)((long)input + lVar11 * 2);
  }
  else {
    local_78._0_8_ = *(undefined8 *)input;
    local_68._0_8_ = *(ulong *)((long)input + lVar11 * 2);
    local_58._0_8_ = *(ulong *)((long)input + (long)(stride * 2) * 2);
    input = (int16_t *)((long)input + (long)(stride * 3) * 2);
  }
  local_58._8_8_ = 0;
  local_68._8_8_ = 0;
  local_78._8_8_ = 0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)input;
  if ((uVar9 & 1) == 0 && !bVar17) {
    auVar18 = pshuflw(auVar19,local_78,0x1b);
    local_78._0_8_ = auVar18._0_8_;
    auVar18 = pshuflw(auVar18,local_68,0x1b);
    local_68._0_8_ = auVar18._0_8_;
    auVar18 = pshuflw(auVar18,local_58,0x1b);
    local_58._0_8_ = auVar18._0_8_;
    auVar19 = pshuflw(auVar18,auVar19,0x1b);
  }
  auVar18 = pmovsxwd(auVar19,local_78._0_8_);
  auVar22 = pmovsxwd(local_a8,local_68._0_8_);
  auVar23 = pmovsxwd(local_98,local_58._0_8_);
  local_48 = auVar19._0_8_;
  auVar19 = pmovsxwd(local_88,local_48);
  local_78._4_4_ = auVar18._4_4_;
  local_78._0_4_ = auVar18._0_4_ << iVar14;
  local_78._8_4_ = auVar18._8_4_;
  local_78._12_4_ = auVar18._12_4_;
  local_68._4_4_ = auVar22._4_4_;
  local_68._0_4_ = auVar22._0_4_ << iVar14;
  local_68._8_4_ = auVar22._8_4_;
  local_68._12_4_ = auVar22._12_4_;
  local_58._4_4_ = auVar23._4_4_;
  local_58._0_4_ = auVar23._0_4_ << iVar14;
  local_58._8_4_ = auVar23._8_4_;
  local_58._12_4_ = auVar23._12_4_;
  local_48._4_4_ = auVar19._4_4_;
  local_48._0_4_ = auVar19._0_4_ << iVar14;
  iStack_40 = auVar19._8_4_;
  iStack_3c = auVar19._12_4_;
  (**(code **)((long)col_highbd_txfm4x8_arr + uVar13))(local_b8,local_b8,0xd,1);
  bVar5 = piVar8[1];
  iVar14 = 1 << (~bVar5 & 0x1f);
  auVar18 = ZEXT416((uint)-(int)(char)bVar5);
  local_b8._4_4_ = local_b8._4_4_ + iVar14 >> auVar18;
  local_b8._0_4_ = local_b8._0_4_ + iVar14 >> auVar18;
  local_b8._8_4_ = local_b8._8_4_ + iVar14 >> auVar18;
  local_b8._12_4_ = local_b8._12_4_ + iVar14 >> auVar18;
  local_a8._4_4_ = local_a8._4_4_ + iVar14 >> auVar18;
  local_a8._0_4_ = local_a8._0_4_ + iVar14 >> auVar18;
  local_a8._8_4_ = local_a8._8_4_ + iVar14 >> auVar18;
  local_a8._12_4_ = local_a8._12_4_ + iVar14 >> auVar18;
  local_98._4_4_ = local_98._4_4_ + iVar14 >> auVar18;
  local_98._0_4_ = local_98._0_4_ + iVar14 >> auVar18;
  local_98._8_4_ = local_98._8_4_ + iVar14 >> auVar18;
  local_98._12_4_ = local_98._12_4_ + iVar14 >> auVar18;
  local_88._4_4_ = local_88._4_4_ + iVar14 >> auVar18;
  local_88._0_4_ = local_88._0_4_ + iVar14 >> auVar18;
  local_88._8_4_ = local_88._8_4_ + iVar14 >> auVar18;
  local_88._12_4_ = local_88._12_4_ + iVar14 >> auVar18;
  local_78._4_4_ = local_78._4_4_ + iVar14 >> auVar18;
  local_78._0_4_ = local_78._0_4_ + iVar14 >> auVar18;
  local_78._8_4_ = local_78._8_4_ + iVar14 >> auVar18;
  local_78._12_4_ = local_78._12_4_ + iVar14 >> auVar18;
  local_68._4_4_ = local_68._4_4_ + iVar14 >> auVar18;
  local_68._0_4_ = local_68._0_4_ + iVar14 >> auVar18;
  local_68._8_4_ = local_68._8_4_ + iVar14 >> auVar18;
  local_68._12_4_ = local_68._12_4_ + iVar14 >> auVar18;
  local_58._4_4_ = local_58._4_4_ + iVar14 >> auVar18;
  local_58._0_4_ = local_58._0_4_ + iVar14 >> auVar18;
  local_58._8_4_ = local_58._8_4_ + iVar14 >> auVar18;
  local_58._12_4_ = local_58._12_4_ + iVar14 >> auVar18;
  local_48._4_4_ = iVar14 + local_48._4_4_ >> auVar18;
  local_48._0_4_ = iVar14 + (int)local_48 >> auVar18;
  iStack_40 = iVar14 + iStack_40 >> auVar18;
  iStack_3c = iVar14 + iStack_3c >> auVar18;
  lVar11 = 0;
  do {
    lVar10 = lVar11 * 0x40;
    pauVar2 = (undefined1 (*) [16])(local_b8 + lVar10);
    auVar18 = *pauVar2;
    auVar19 = *(undefined1 (*) [16])(local_98 + lVar10);
    auVar22 = *(undefined1 (*) [16])(local_88 + lVar10);
    auVar24._0_8_ = auVar18._0_8_;
    auVar24._8_4_ = auVar18._4_4_;
    auVar24._12_4_ = *(undefined4 *)(local_a8 + lVar10 + 4);
    auVar26._0_8_ = auVar19._0_8_;
    auVar26._8_4_ = auVar19._4_4_;
    auVar26._12_4_ = auVar22._4_4_;
    auVar23._0_8_ = CONCAT44(*(undefined4 *)(local_a8 + lVar10 + 8),auVar18._8_4_);
    auVar23._8_4_ = auVar18._12_4_;
    auVar23._12_4_ = *(undefined4 *)(local_98 + lVar10 + -4);
    auVar20._0_8_ = CONCAT44(auVar22._8_4_,auVar19._8_4_);
    auVar20._8_4_ = auVar19._12_4_;
    auVar20._12_4_ = auVar22._12_4_;
    *(ulong *)*pauVar2 = CONCAT44(*(undefined4 *)(local_a8 + lVar10),auVar18._0_4_);
    *(ulong *)(local_b8 + lVar10 + 8) = CONCAT44(auVar22._0_4_,auVar19._0_4_);
    auVar25._8_8_ = auVar26._8_8_;
    auVar25._0_8_ = auVar24._8_8_;
    *(undefined1 (*) [16])(local_a8 + lVar10) = auVar25;
    *(undefined8 *)(local_98 + lVar10) = auVar23._0_8_;
    *(undefined8 *)(local_98 + lVar10 + 8) = auVar20._0_8_;
    *(long *)(local_88 + lVar10) = auVar23._8_8_;
    *(long *)(local_88 + lVar10 + 8) = auVar20._8_8_;
    (*pcVar6)(pauVar2,pauVar2,0xd,1);
    bVar5 = piVar8[2];
    if ((char)bVar5 < '\0') {
      iVar14 = 1 << (~bVar5 & 0x1f);
      auVar18 = ZEXT416((uint)-(int)(char)bVar5);
      lVar10 = 0;
      auVar19 = pmovsxwd(auVar22,0x16a116a116a116a1);
      auVar22 = pmovsxwd(auVar25,0x800080008000800);
      do {
        piVar3 = (int *)(puVar16 + lVar10);
        auVar21._0_4_ = *piVar3 + iVar14 >> auVar18;
        auVar21._4_4_ = piVar3[1] + iVar14 >> auVar18;
        auVar21._8_4_ = piVar3[2] + iVar14 >> auVar18;
        auVar21._12_4_ = piVar3[3] + iVar14 >> auVar18;
        auVar23 = pmulld(auVar21,auVar19);
        piVar3 = (int *)(puVar16 + lVar10);
        *piVar3 = auVar23._0_4_ + auVar22._0_4_ >> 0xc;
        piVar3[1] = auVar23._4_4_ + auVar22._4_4_ >> 0xc;
        piVar3[2] = auVar23._8_4_ + auVar22._8_4_ >> 0xc;
        piVar3[3] = auVar23._12_4_ + auVar22._12_4_ >> 0xc;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
    }
    else {
      lVar10 = 0;
      auVar18 = pmovsxwd(auVar20,0x16a116a116a116a1);
      auVar19 = pmovsxwd(auVar22,0x800080008000800);
      do {
        piVar3 = (int *)(puVar16 + lVar10);
        auVar22._0_4_ = *piVar3 << (int)(char)bVar5;
        auVar22._4_4_ = piVar3[1];
        auVar22._8_4_ = piVar3[2];
        auVar22._12_4_ = piVar3[3];
        auVar22 = pmulld(auVar22,auVar18);
        piVar3 = (int *)(puVar16 + lVar10);
        *piVar3 = auVar22._0_4_ + auVar19._0_4_ >> 0xc;
        piVar3[1] = auVar22._4_4_ + auVar19._4_4_ >> 0xc;
        piVar3[2] = auVar22._8_4_ + auVar19._8_4_ >> 0xc;
        piVar3[3] = auVar22._12_4_ + auVar19._12_4_ >> 0xc;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
    }
    lVar10 = 0;
    do {
      uVar7 = *(undefined8 *)((long)(puVar16 + lVar10) + 8);
      puVar4 = (undefined8 *)((long)coeff + lVar10 * 2);
      *puVar4 = *(undefined8 *)(puVar16 + lVar10);
      puVar4[1] = uVar7;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x40);
    puVar16 = puVar16 + 0x40;
    coeff = coeff + 4;
    bVar17 = lVar11 == 0;
    lVar11 = lVar11 + 1;
  } while (bVar17);
  return;
}

Assistant:

void av1_fwd_txfm2d_4x8_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X8];
  const int txw_idx = get_txw_idx(TX_4X8);
  const int txh_idx = get_txh_idx(TX_4X8);
  const int txfm_size_col = tx_size_wide[TX_4X8];
  const int txfm_size_row = tx_size_high[TX_4X8];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x4_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_4x8(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, in, bitcol, 1);
  col_txfm_4x8_rounding(in, -shift[1]);

  for (int i = 0; i < 2; i++) {
    __m128i *cur_in = &in[i * 4];
    transpose_32bit_4x4(cur_in, cur_in);
    row_txfm(cur_in, cur_in, bitrow, 1);
    av1_round_shift_rect_array_32_sse4_1(cur_in, cur_in, txfm_size_col,
                                         -shift[2], NewSqrt2);
    store_output_w4(coeff + i * 4, cur_in, txfm_size_row, 4);
  }
  (void)bd;
}